

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O0

void __thiscall
ear::throw_if_not_implemented::operator()
          (throw_if_not_implemented *this,CartesianScreen *divergence)

{
  not_implemented *this_00;
  allocator<char> local_39;
  string local_38;
  CartesianScreen *local_18;
  CartesianScreen *divergence_local;
  throw_if_not_implemented *this_local;
  
  if ((divergence->aspectRatio == 0.0) && (!NAN(divergence->aspectRatio))) {
    return;
  }
  local_18 = divergence;
  divergence_local = (CartesianScreen *)this;
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"divergence",&local_39);
  not_implemented::not_implemented(this_00,&local_38);
  __cxa_throw(this_00,&not_implemented::typeinfo,not_implemented::~not_implemented);
}

Assistant:

void operator()(const CartesianObjectDivergence& divergence) const {
      if (divergence.divergence != 0.0) throw not_implemented("divergence");
    }